

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  Value *pVVar2;
  reference value;
  ostream *this;
  Value local_340;
  undefined1 local_318 [8];
  string stg;
  undefined1 local_2d0 [8];
  Value outputJSON;
  string local_288 [39];
  allocator local_261;
  value_type local_260;
  string local_240;
  string local_220;
  string local_200;
  int local_1e0;
  allocator local_1d9;
  int i_1;
  allocator local_1b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  undefined1 local_190 [8];
  string myin;
  Reader reader;
  Value input_json;
  undefined1 local_28 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vtmp;
  int i;
  
  vtmp.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  for (vtmp.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
      (int)vtmp.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage < 5;
      vtmp.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
           (int)vtmp.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_28);
    std::
    vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::push_back(&all_card_abi_cxx11_,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_28);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_28);
  }
  Json::Value::Value((Value *)&reader.features_,nullValue);
  Json::Reader::Reader((Reader *)((long)&myin.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1b0,
             "{\"requests\":[\"0 2 1\",\"1 0 0 0 0 F3 T6 W5 B7 W2 T7 W1 B2 W9 T3 W4 W7 T5\",\"3 0 DRAW\",\"3 0 PLAY J2\",\"3 1 DRAW\",\"3 1 PLAY F3\",\"2 B3\",\"3 2 PLAY F3\",\"3 3 DRAW\",\"3 3 PLAY W8\",\"3 0 DRAW\",\"3 0 PLAY B8\",\"3 3 PENG B2\",\"3 0 DRAW\",\"3 0 PLAY B4\",\"3 1 DRAW\",\"3 1 PLAY B4\",\"3 2 CHI B3 W1\",\"3 3 DRAW\",\"3 3 PLAY B1\",\"3 0 DRAW\",\"3 0 PLAY B5\",\"3 1 DRAW\",\"3 1 PLAY B1\",\"2 F2\",\"3 2 PLAY F2\",\"3 3 DRAW\",\"3 3 PLAY J1\",\"3 0 DRAW\",\"3 0 PLAY B5\",\"3 1 DRAW\",\"3 1 PLAY J1\",\"2 W1\",\"3 2 PLAY W1\",\"3 3 DRAW\",\"3 3 PLAY T5\",\"3 0 DRAW\",\"3 0 PLAY B9\",\"3 1 DRAW\",\"3 1 PLAY J2\",\"2 F1\",\"3 2 PLAY F1\",\"3 3 DRAW\",\"3 3 PLAY T8\",\"3 0 DRAW\",\"3 0 PLAY B6\",\"3 1 CHI B6 B9\",\"2 W4\",\"3 2 PLAY B7\",\"3 3 DRAW\",\"3 3 PLAY W3\",\"3 0 DRAW\",\"3 0 PLAY B1\",\"3 1 DRAW\",\"3 1 PLAY F4\",\"2 B3\",\"3 2 PLAY B3\",\"3 3 DRAW\",\"3 3 PLAY J2\",\"3 0 DRAW\",\"3 0 PLAY W7\",\"3 1 CHI W7 J3\",\"2 W5\",\"3 2 PLAY W7\",\"3 3 DRAW\",\"3 3 PLAY T3\",\"3 0 DRAW\",\"3 0 PLAY T9\",\"3 1 DRAW\",\"3 1 PLAY F4\",\"2 B2\",\"3 2 PLAY B2\",\"3 3 DRAW\",\"3 3 PLAY W3\",\"3 0 DRAW\",\"3 0 PLAY T3\",\"3 1 DRAW\",\"3 1 PLAY W2\",\"2 W3\",\"3 2 PLAY W3\",\"3 3 CHI W2 W5\",\"3 2 PENG W2\",\"3 3 DRAW\",\"3 3 PLAY F3\",\"3 0 DRAW\",\"3 0 PLAY T2\",\"3 1 DRAW\",\"3 1 PLAY B4\",\"2 J3\",\"3 2 PLAY J3\",\"3 3 DRAW\",\"3 3 PLAY T1\",\"3 0 DRAW\",\"3 0 PLAY B6\",\"3 1 DRAW\",\"3 1 PLAY F1\",\"3 3 PENG W5\",\"3 0 DRAW\",\"3 0 PLAY W8\",\"3 1 DRAW\",\"3 1 PLAY B9\",\"2 F3\",\"3 2 PLAY F3\",\"3 3 DRAW\",\"3 3 PLAY W3\",\"3 0 DRAW\",\"3 0 PLAY T1\",\"3 1 DRAW\",\"3 1 PLAY T2\",\"2 W6\",\"3 2 PLAY T3\",\"3 3 DRAW\",\"3 3 PLAY B7\",\"3 0 DRAW\",\"3 0 PLAY T1\",\"3 1 DRAW\",\"3 1 PLAY B3\",\"2 B8\",\"3 2 PLAY W6\",\"3 3 DRAW\",\"3 3 PLAY W7\",\"3 0 DRAW\",\"3 0 PLAY F2\",\"3 1 DRAW\",\"3 1 PLAY W9\",\"2 W4\",\"3 2 PLAY W9\",\"3 3 DRAW\",\"3 3 PLAY B9\",\"3 0 DRAW\",\"3 0 PLAY T8\",\"3 1 DRAW\",\"3 1 PLAY W2\",\"2 B3\",\"3 2 PLAY T5\",\"3 3 DRAW\",\"3 3 PLAY J3\",\"3 0 DRAW\",\"3 0 PLAY B6\",\"3 1 DRAW\",\"3 1 PLAY B6\",\"2 B2\",\"3 2 PLAY B8\",\"3 3 DRAW\",\"3 3 PLAY T2\",\"3 0 DRAW\",\"3 0 PLAY J1\",\"3 1 DRAW\",\"3 1 PLAY T9\",\"2 T6\",\"3 2 PLAY T7\",\"3 3 DRAW\",\"3 3 PLAY B7\",\"3 0 DRAW\",\"3 0 PLAY B1\",\"3 1 DRAW\",\"3 1 PLAY F2\"],\"responses\":[\"PASS\",\"PASS\",\"PASS\",\"PASS"
             ,&local_1b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&i_1,
             "\",\"PASS\",\"PASS\",\"PLAY F3\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"CHI B3 W1\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY F2\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY W1\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY F1\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY B7\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY B3\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY W7\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY B2\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY W3\",\"PASS\",\"PENG W2\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY J3\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY F3\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY T3\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY W6\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY W9\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY T5\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY B8\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY T7\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\"]}"
             ,&local_1d9);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190,
                 &local_1b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i_1);
  std::__cxx11::string::~string((string *)&i_1);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
  Json::Reader::parse((Reader *)((long)&myin.field_2 + 8),(string *)local_190,
                      (Value *)&reader.features_,true);
  pVVar2 = Json::Value::operator[]((Value *)&reader.features_,"responses");
  turn_id = Json::Value::size(pVVar2);
  for (local_1e0 = 0; local_1e0 < turn_id; local_1e0 = local_1e0 + 1) {
    pVVar2 = Json::Value::operator[]((Value *)&reader.features_,"requests");
    pVVar2 = Json::Value::operator[](pVVar2,local_1e0);
    Json::Value::asString_abi_cxx11_(&local_200,pVVar2);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&request_abi_cxx11_,&local_200);
    std::__cxx11::string::~string((string *)&local_200);
    pVVar2 = Json::Value::operator[]((Value *)&reader.features_,"responses");
    pVVar2 = Json::Value::operator[](pVVar2,local_1e0);
    Json::Value::asString_abi_cxx11_(&local_220,pVVar2);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&response_abi_cxx11_,&local_220);
    std::__cxx11::string::~string((string *)&local_220);
  }
  pVVar2 = Json::Value::operator[]((Value *)&reader.features_,"requests");
  pVVar2 = Json::Value::operator[](pVVar2,turn_id);
  Json::Value::asString_abi_cxx11_(&local_240,pVVar2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&request_abi_cxx11_,&local_240);
  std::__cxx11::string::~string((string *)&local_240);
  if (turn_id < 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_260,"PASS",&local_261);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&response_abi_cxx11_,&local_260);
    std::__cxx11::string::~string((string *)&local_260);
    std::allocator<char>::~allocator((allocator<char> *)&local_261);
  }
  else {
    initCondition_abi_cxx11_();
    std::__cxx11::string::operator=((string *)&stmp_abi_cxx11_,local_288);
    std::__cxx11::string::~string(local_288);
    std::__cxx11::string::operator=((string *)&current_card_abi_cxx11_,(string *)&stmp_abi_cxx11_);
    std::ios::clear((long)&str_in_abi_cxx11_ + *(long *)(str_in_abi_cxx11_ + -0x18),0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](&request_abi_cxx11_,(long)turn_id);
    std::__cxx11::istringstream::str((string *)&str_in_abi_cxx11_);
    std::istream::operator>>((istream *)&str_in_abi_cxx11_,&itmp);
    if (itmp == 2) {
      playCard();
    }
    else if (itmp == 3) {
      bVar1 = std::operator!=(&stmp_abi_cxx11_,"Fail");
      if (bVar1) {
        responseOutTurn();
      }
      else {
        std::operator<<((ostream *)str_out_abi_cxx11_,"PASS");
      }
    }
    std::__cxx11::ostringstream::str();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&response_abi_cxx11_,(value_type *)&outputJSON.limit_);
    std::__cxx11::string::~string((string *)&outputJSON.limit_);
  }
  Json::Value::Value((Value *)local_2d0,nullValue);
  value = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](&response_abi_cxx11_,(long)turn_id);
  Json::Value::Value((Value *)((long)&stg.field_2 + 8),value);
  pVVar2 = Json::Value::operator[]((Value *)local_2d0,"response");
  Json::Value::operator=(pVVar2,(Value *)((long)&stg.field_2 + 8));
  Json::Value::~Value((Value *)((long)&stg.field_2 + 8));
  std::__cxx11::string::string((string *)local_318);
  if (current_strategy == 1) {
    std::__cxx11::string::operator=((string *)local_318,anon_var_dwarf_2326e);
  }
  else if (current_strategy == 2) {
    std::__cxx11::string::operator=((string *)local_318,anon_var_dwarf_2327b);
  }
  else if (current_strategy == 3) {
    std::__cxx11::string::operator=((string *)local_318,anon_var_dwarf_23288);
  }
  else if (current_strategy == 3) {
    std::__cxx11::string::operator=((string *)local_318,anon_var_dwarf_23295);
  }
  Json::Value::Value(&local_340,(string *)local_318);
  pVVar2 = Json::Value::operator[]((Value *)local_2d0,"debug");
  Json::Value::operator=(pVVar2,&local_340);
  Json::Value::~Value(&local_340);
  this = Json::operator<<((ostream *)&std::cout,(Value *)local_2d0);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  vtmp.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  std::__cxx11::string::~string((string *)local_318);
  Json::Value::~Value((Value *)local_2d0);
  std::__cxx11::string::~string((string *)local_190);
  Json::Reader::~Reader((Reader *)((long)&myin.field_2 + 8));
  Json::Value::~Value((Value *)&reader.features_);
  return vtmp.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
}

Assistant:

int main() {
    //初始化all_card 0-3是四个玩家，4是桌上的牌
    for (int i = 0; i < 5; i++) {
        vector<string> vtmp;
        all_card.push_back(vtmp);
    }

    //
    //Json交互的输入（删掉了普通交互）
    Json::Value input_json;
#ifdef _BOTZONE_ONLINE
    cin >> input_json;
#else
    //==========debug============
    Json::Reader reader;
    string myin = string("{\"requests\":[\"0 2 1\",\"1 0 0 0 0 F3 T6 W5 B7 W2 T7 W1 B2 W9 T3 W4 W7 T5\",\"3 0 DRAW\",\"3 0 PLAY J2\",\"3 1 DRAW\",\"3 1 PLAY F3\",\"2 B3\",\"3 2 PLAY F3\",\"3 3 DRAW\",\"3 3 PLAY W8\",\"3 0 DRAW\",\"3 0 PLAY B8\",\"3 3 PENG B2\",\"3 0 DRAW\",\"3 0 PLAY B4\",\"3 1 DRAW\",\"3 1 PLAY B4\",\"3 2 CHI B3 W1\",\"3 3 DRAW\",\"3 3 PLAY B1\",\"3 0 DRAW\",\"3 0 PLAY B5\",\"3 1 DRAW\",\"3 1 PLAY B1\",\"2 F2\",\"3 2 PLAY F2\",\"3 3 DRAW\",\"3 3 PLAY J1\",\"3 0 DRAW\",\"3 0 PLAY B5\",\"3 1 DRAW\",\"3 1 PLAY J1\",\"2 W1\",\"3 2 PLAY W1\",\"3 3 DRAW\",\"3 3 PLAY T5\",\"3 0 DRAW\",\"3 0 PLAY B9\",\"3 1 DRAW\",\"3 1 PLAY J2\",\"2 F1\",\"3 2 PLAY F1\",\"3 3 DRAW\",\"3 3 PLAY T8\",\"3 0 DRAW\",\"3 0 PLAY B6\",\"3 1 CHI B6 B9\",\"2 W4\",\"3 2 PLAY B7\",\"3 3 DRAW\",\"3 3 PLAY W3\",\"3 0 DRAW\",\"3 0 PLAY B1\",\"3 1 DRAW\",\"3 1 PLAY F4\",\"2 B3\",\"3 2 PLAY B3\",\"3 3 DRAW\",\"3 3 PLAY J2\",\"3 0 DRAW\",\"3 0 PLAY W7\",\"3 1 CHI W7 J3\",\"2 W5\",\"3 2 PLAY W7\",\"3 3 DRAW\",\"3 3 PLAY T3\",\"3 0 DRAW\",\"3 0 PLAY T9\",\"3 1 DRAW\",\"3 1 PLAY F4\",\"2 B2\",\"3 2 PLAY B2\",\"3 3 DRAW\",\"3 3 PLAY W3\",\"3 0 DRAW\",\"3 0 PLAY T3\",\"3 1 DRAW\",\"3 1 PLAY W2\",\"2 W3\",\"3 2 PLAY W3\",\"3 3 CHI W2 W5\",\"3 2 PENG W2\",\"3 3 DRAW\",\"3 3 PLAY F3\",\"3 0 DRAW\",\"3 0 PLAY T2\",\"3 1 DRAW\",\"3 1 PLAY B4\",\"2 J3\",\"3 2 PLAY J3\",\"3 3 DRAW\",\"3 3 PLAY T1\",\"3 0 DRAW\",\"3 0 PLAY B6\",\"3 1 DRAW\",\"3 1 PLAY F1\",\"3 3 PENG W5\",\"3 0 DRAW\",\"3 0 PLAY W8\",\"3 1 DRAW\",\"3 1 PLAY B9\",\"2 F3\",\"3 2 PLAY F3\",\"3 3 DRAW\",\"3 3 PLAY W3\",\"3 0 DRAW\",\"3 0 PLAY T1\",\"3 1 DRAW\",\"3 1 PLAY T2\",\"2 W6\",\"3 2 PLAY T3\",\"3 3 DRAW\",\"3 3 PLAY B7\",\"3 0 DRAW\",\"3 0 PLAY T1\",\"3 1 DRAW\",\"3 1 PLAY B3\",\"2 B8\",\"3 2 PLAY W6\",\"3 3 DRAW\",\"3 3 PLAY W7\",\"3 0 DRAW\",\"3 0 PLAY F2\",\"3 1 DRAW\",\"3 1 PLAY W9\",\"2 W4\",\"3 2 PLAY W9\",\"3 3 DRAW\",\"3 3 PLAY B9\",\"3 0 DRAW\",\"3 0 PLAY T8\",\"3 1 DRAW\",\"3 1 PLAY W2\",\"2 B3\",\"3 2 PLAY T5\",\"3 3 DRAW\",\"3 3 PLAY J3\",\"3 0 DRAW\",\"3 0 PLAY B6\",\"3 1 DRAW\",\"3 1 PLAY B6\",\"2 B2\",\"3 2 PLAY B8\",\"3 3 DRAW\",\"3 3 PLAY T2\",\"3 0 DRAW\",\"3 0 PLAY J1\",\"3 1 DRAW\",\"3 1 PLAY T9\",\"2 T6\",\"3 2 PLAY T7\",\"3 3 DRAW\",\"3 3 PLAY B7\",\"3 0 DRAW\",\"3 0 PLAY B1\",\"3 1 DRAW\",\"3 1 PLAY F2\"],\"responses\":[\"PASS\",\"PASS\",\"PASS\",\"PASS") + string("\",\"PASS\",\"PASS\",\"PLAY F3\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"CHI B3 W1\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY F2\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY W1\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY F1\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY B7\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY B3\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY W7\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY B2\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY W3\",\"PASS\",\"PENG W2\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY J3\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY F3\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY T3\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY W6\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY W9\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY T5\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY B8\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY T7\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\"]}");
    reader.parse(myin, input_json);
    //==========debug============
#endif
    //当前回合的下标（即总共回合数量-1）
    turn_id = input_json["responses"].size();
    //读取交互信息，存入request和response
    for (int i = 0; i < turn_id; i++) {
        request.push_back(input_json["requests"][i].asString());
        response.push_back(input_json["responses"][i].asString());
    }
    request.push_back(input_json["requests"][turn_id].asString());

    if (turn_id < 2) { //如果当前回合数是1或0
        response.push_back("PASS");
    }
    else { //如果这局itmp是2，stmp就是我在这局摸到的牌，如果这局itmp是3，只有别的玩家出牌了才会返回出的是什么牌，其他都返回“Fail”
        stmp = initCondition();
        //stmp = "Fail";//debug用
        current_card = stmp;
        str_in.clear();
        str_in.str(request[turn_id]);
        str_in >> itmp;
        //for (int i = 0; i < all_card[my_player_id].size(); i++)
        //	str_out << all_card[my_player_id][i] << " ";
        if (itmp == 2) { //到我的时候，这时stmp就是牌的信息
            playCard();
        }
            //3 2 PLAY T1
        else if (itmp == 3) {
            if (stmp != "Fail") {
                //bugang
                //if (find(peng.begin(), peng.end(), stmp) != peng.end()) {
                //	doBUGANG();
                //}
                //else{
                //str_out << stmp << " ";
                //str_out << "PASS";
                responseOutTurn();
                //}
            }
            else
                str_out << "PASS";
        }
        response.push_back(str_out.str());
    }

    //Json交互的输出（删掉了普通交互）
    Json::Value outputJSON;
    outputJSON["response"] = response[turn_id];

    //========debug==========
    string stg;
    if (current_strategy == STG_PENG_PENG) { stg = "碰碰胡";}
    else if (current_strategy == STG_HUN_YI_SE) { stg = "混一色"; }
    else if (current_strategy == STG_QUAN_QIU_REN) { stg = "全求人"; }
    else if (current_strategy == STG_WU_MEN) { stg = "五门齐"; }
    outputJSON["debug"] = stg;
    //========debug==========

    cout << outputJSON << endl;
    return 0;
}